

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O0

size_t wwOctetSize(word *a,size_t n)

{
  size_t sVar1;
  bool bVar2;
  word mask;
  size_t pos;
  size_t n_local;
  word *a_local;
  size_t local_8;
  
  n_local = n;
  do {
    sVar1 = n_local - 1;
    bVar2 = false;
    if (n_local != 0) {
      bVar2 = a[sVar1] == 0;
    }
    n_local = sVar1;
  } while (bVar2);
  if (sVar1 == 0xffffffffffffffff) {
    local_8 = 0;
  }
  else {
    pos = 7;
    for (mask = 0xff00000000000000; (a[sVar1] & mask) == 0; mask = mask >> 8) {
      pos = pos - 1;
    }
    local_8 = sVar1 * 8 + pos + 1;
  }
  return local_8;
}

Assistant:

size_t wwOctetSize(const word a[], size_t n)
{
	ASSERT(wwIsValid(a, n));
	while (n-- && a[n] == 0);
	if (n == SIZE_MAX)
		return 0;
	{
		size_t pos = O_PER_W - 1;
		word mask = (word)0xFF << 8 * pos;
		while ((a[n] & mask) == 0)
			--pos, mask >>= 8;
		return n * O_PER_W + pos + 1;
	}
}